

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void post_decrement_suite::test_string(void)

{
  index_type *this;
  bool bVar1;
  basic_variable<std::allocator<char>> *this_00;
  iterator local_c0;
  iterator local_a8;
  undefined1 local_90 [8];
  iterator result;
  undefined1 local_50 [8];
  iterator where;
  variable data;
  
  this = &where.
          super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
          .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)this,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)local_50,(basic_variable<std::allocator<char>_> *)this);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &result.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_50,
                     (iterator *)
                     &result.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x664,"void post_decrement_suite::test_string()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &result.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--((iterator *)local_90,
               (iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_50,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_a8,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_50,&local_a8);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x666,"void post_decrement_suite::test_string()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a8);
  this_00 = (basic_variable<std::allocator<char>> *)
            trial::dynamic::basic_variable<std::allocator<char>_>::
            iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
            ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                          *)local_50);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::string>(this_00);
  boost::detail::test_impl
            ("where->same<variable::string_type>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x667,"void post_decrement_suite::test_string()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_c0,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_90,&local_c0);
  boost::detail::test_impl
            ("result == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x668,"void post_decrement_suite::test_string()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  return;
}

Assistant:

void test_string()
{
    variable data("alpha");
    variable::iterator where = data.end();
    TRIAL_PROTOCOL_TEST(where == data.end());
    variable::iterator result = where--;
    TRIAL_PROTOCOL_TEST(where != data.end());
    TRIAL_PROTOCOL_TEST(where->same<variable::string_type>());
    TRIAL_PROTOCOL_TEST(result == data.end());
}